

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_test_connection.c
# Opt level: O1

apx_error_t
apx_serverTestConnection_write_remote_data
          (apx_serverTestConnection_t *self,uint32_t address,uint8_t *payload_data,
          apx_size_t payload_size)

{
  apx_size_t aVar1;
  apx_error_t aVar2;
  apx_fileManager_t *self_00;
  uint8_t *msg_data;
  ulong __n;
  uint8_t header [4];
  uint8_t local_3c [4];
  uint8_t *local_38;
  
  aVar2 = 1;
  if (payload_size != 0 && self != (apx_serverTestConnection_t *)0x0) {
    self_00 = apx_serverConnection_get_file_manager(&self->base);
    if (self_00 == (apx_fileManager_t *)0x0) {
      __assert_fail("file_manager != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server_test_connection.c"
                    ,0x159,
                    "apx_error_t apx_serverTestConnection_write_remote_data(apx_serverTestConnection_t *, uint32_t, const uint8_t *, apx_size_t)"
                   );
    }
    aVar1 = rmf_address_encode(local_3c,4,address,false);
    if (aVar1 == 0) {
      aVar2 = 6;
    }
    else {
      __n = (ulong)aVar1;
      local_38 = payload_data;
      msg_data = (uint8_t *)malloc(__n + payload_size);
      if (msg_data == (uint8_t *)0x0) {
        aVar2 = 2;
      }
      else {
        memcpy(msg_data,local_3c,__n);
        memcpy(msg_data + __n,local_38,(ulong)payload_size);
        aVar2 = apx_fileManager_message_received(self_00,msg_data,aVar1 + payload_size);
        free(msg_data);
      }
    }
  }
  return aVar2;
}

Assistant:

apx_error_t apx_serverTestConnection_write_remote_data(apx_serverTestConnection_t* self, uint32_t address, uint8_t const* payload_data, apx_size_t payload_size)
{
   if ((self != NULL) && (payload_size > 0))
   {
      uint8_t header[RMF_HIGH_ADDR_SIZE];
      apx_fileManager_t* file_manager = apx_serverConnection_get_file_manager(&self->base);
      assert(file_manager != NULL);
      apx_size_t header_size = (apx_size_t)rmf_address_encode(header, sizeof(header), address, false);
      if (header_size == 0u)
      {
         return APX_INTERNAL_ERROR;
      }
      apx_error_t retval = APX_MEM_ERROR;
      uint8_t* msg = (uint8_t*)malloc(((size_t)header_size) + payload_size);
      if (msg != NULL)
      {
         memcpy(msg, &header[0], header_size);
         memcpy(msg + header_size, payload_data, payload_size);
         retval = apx_fileManager_message_received(file_manager, msg, header_size + payload_size);
         free(msg);
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}